

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O0

void __thiscall crypto::xchacha20::update(xchacha20 *this)

{
  word *in_RDI;
  size_t i;
  word *in_stack_fffffffffffffff0;
  ulong uVar1;
  
  memcpy(in_RDI + 0x10,in_RDI,0x40);
  run_rounds(in_stack_fffffffffffffff0);
  for (uVar1 = 0; uVar1 < 0x10; uVar1 = uVar1 + 1) {
    in_RDI[uVar1 + 0x10] = in_RDI[uVar1] + in_RDI[uVar1 + 0x10];
  }
  increment_count(in_RDI,1);
  return;
}

Assistant:

void xchacha20::update() {
	
	std::memcpy(keystream, state, sizeof(state));
	run_rounds(keystream);
	
	for(size_t i = 0; i < 16; i++) {
		keystream[i] += state[i];
	}
	
	increment_count(state);
	
}